

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O1

void mvlinec4(void)

{
  int iVar1;
  BYTE *pBVar2;
  byte bVar3;
  int iVar4;
  
  iVar1 = mvlinebits;
  pBVar2 = dc_dest;
  iVar4 = dc_count;
  do {
    bVar3 = (byte)iVar1;
    if ((ulong)bufplce[0][vplce[0] >> (bVar3 & 0x3f)] != 0) {
      *pBVar2 = palookupoffse[0][bufplce[0][vplce[0] >> (bVar3 & 0x3f)]];
    }
    vplce[0] = vplce[0] + vince[0];
    if ((ulong)bufplce[1][vplce[1] >> (bVar3 & 0x3f)] != 0) {
      pBVar2[1] = palookupoffse[1][bufplce[1][vplce[1] >> (bVar3 & 0x3f)]];
    }
    vplce[1] = vplce[1] + vince[1];
    if ((ulong)bufplce[2][vplce[2] >> (bVar3 & 0x3f)] != 0) {
      pBVar2[2] = palookupoffse[2][bufplce[2][vplce[2] >> (bVar3 & 0x3f)]];
    }
    vplce[2] = vplce[2] + vince[2];
    if ((ulong)bufplce[3][vplce[3] >> (bVar3 & 0x3f)] != 0) {
      pBVar2[3] = palookupoffse[3][bufplce[3][vplce[3] >> (bVar3 & 0x3f)]];
    }
    vplce[3] = vplce[3] + vince[3];
    pBVar2 = pBVar2 + dc_pitch;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  return;
}

Assistant:

void mvlinec4 ()
{
	BYTE *dest = dc_dest;
	int count = dc_count;
	int bits = mvlinebits;
	DWORD place;

	do
	{
		BYTE pix;

		pix = bufplce[0][(place=vplce[0])>>bits]; if(pix) dest[0] = palookupoffse[0][pix]; vplce[0] = place+vince[0];
		pix = bufplce[1][(place=vplce[1])>>bits]; if(pix) dest[1] = palookupoffse[1][pix]; vplce[1] = place+vince[1];
		pix = bufplce[2][(place=vplce[2])>>bits]; if(pix) dest[2] = palookupoffse[2][pix]; vplce[2] = place+vince[2];
		pix = bufplce[3][(place=vplce[3])>>bits]; if(pix) dest[3] = palookupoffse[3][pix]; vplce[3] = place+vince[3];
		dest += dc_pitch;
	} while (--count);
}